

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

void RunConstantPropagation(ExpressionContext *ctx,VmModule *module,VmValue *value,bool nested)

{
  VmValueType VVar1;
  int iVar2;
  VmValue *pVVar3;
  VmValue *pVVar4;
  long lVar5;
  double value_00;
  VmConstant *pVVar6;
  uint uVar7;
  ulong uVar8;
  VariableData *container;
  char *__function;
  int iVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  SmallArray<VmConstant_*,_32U> consts;
  SmallArray<VmConstant_*,_32U> local_148;
  
  if (value == (VmValue *)0x0) {
    return;
  }
  uVar11 = value->typeID;
  if (uVar11 != 2) {
    if (uVar11 == 3) {
      pVVar4 = (VmValue *)value[1].comment.end;
      while (pVVar4 != (VmValue *)0x0) {
        pVVar3 = pVVar4[1].users.little[0];
        RunConstantPropagation(ctx,module,pVVar4,nested);
        pVVar4 = pVVar3;
      }
      return;
    }
    if (uVar11 != 4) {
      return;
    }
    pVVar4 = (VmValue *)value[1].source;
    while (pVVar4 != (VmValue *)0x0) {
      pVVar3 = (VmValue *)pVVar4[1].comment.begin;
      RunConstantPropagation(ctx,module,pVVar4,nested);
      pVVar4 = pVVar3;
    }
    return;
  }
  VVar1 = (value->type).type;
  uVar11 = (value->type).size;
  if (uVar11 != 4 || VVar1 != VM_TYPE_INT) {
    if ((VVar1 != VM_TYPE_POINTER) && ((VVar1 & ~VM_TYPE_INT) != VM_TYPE_DOUBLE || uVar11 != 8)) {
      return;
    }
  }
  local_148.allocator = module->allocator;
  local_148.data = local_148.little;
  local_148.count = 0;
  local_148.max = 0x20;
  if (value[1].type.type == VM_TYPE_VOID) {
    uVar11 = 0;
  }
  else {
    uVar11 = 0;
    uVar12 = 0;
    do {
      pVVar6 = *(VmConstant **)(*(long *)&value[1].typeID + uVar12 * 8);
      if ((pVVar6 == (VmConstant *)0x0) || ((pVVar6->super_VmValue).typeID != 1)) {
        if (!nested) goto switchD_0019664c_caseD_8;
        RunConstantPropagation(ctx,module,&pVVar6->super_VmValue,true);
        if (value[1].type.type <= uVar12) {
          __function = 
          "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]";
          goto LAB_00197590;
        }
        pVVar6 = *(VmConstant **)(*(long *)&value[1].typeID + uVar12 * 8);
        if ((pVVar6 == (VmConstant *)0x0) || ((pVVar6->super_VmValue).typeID != 1))
        goto switchD_0019664c_caseD_8;
        uVar11 = local_148.count;
      }
      if (uVar11 == local_148.max) {
        SmallArray<VmConstant_*,_32U>::grow(&local_148,uVar11);
      }
      if (local_148.data == (VmConstant **)0x0) {
        __assert_fail("data",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x162,
                      "void SmallArray<VmConstant *, 32>::push_back(const T &) [T = VmConstant *, N = 32]"
                     );
      }
      uVar8 = local_148._8_8_ & 0xffffffff;
      uVar11 = local_148.count + 1;
      local_148.count = uVar11;
      local_148.data[uVar8] = pVVar6;
      uVar12 = uVar12 + 1;
    } while (uVar12 < value[1].type.type);
  }
  switch(*(undefined4 *)&value[1]._vptr_VmValue) {
  case 7:
    VVar1 = (value->type).type;
    uVar7 = (value->type).size;
    if (uVar7 == 4 && VVar1 == VM_TYPE_INT) {
      if (uVar11 == 0) goto LAB_0019759a;
      uVar11 = (*local_148.data)->iValue;
      goto LAB_001972fc;
    }
    uVar7 = uVar7 ^ 8;
    if (VVar1 == VM_TYPE_DOUBLE && uVar7 == 0) {
      if (uVar11 == 0) goto LAB_0019759a;
      value_00 = (*local_148.data)->dValue;
      goto LAB_00197450;
    }
    if (VVar1 != VM_TYPE_LONG || uVar7 != 0) goto switchD_0019664c_caseD_8;
    if (uVar11 == 0) goto LAB_0019759a;
    uVar12 = (*local_148.data)->lValue;
    break;
  default:
    goto switchD_0019664c_caseD_8;
  case 0xf:
    if (uVar11 == 0) {
LAB_0019759a:
      __function = 
      "T &SmallArray<VmConstant *, 32>::operator[](unsigned int) [T = VmConstant *, N = 32]";
LAB_00197590:
      __assert_fail("index < count",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x199,__function);
    }
    uVar11 = (uint)(*local_148.data)->dValue;
    goto LAB_001972fc;
  case 0x10:
    if (uVar11 == 0) goto LAB_0019759a;
    uVar12 = (ulong)(*local_148.data)->dValue;
    break;
  case 0x11:
    if (uVar11 == 0) goto LAB_0019759a;
    pVVar6 = CreateConstantInt(module->allocator,value->source,(int)(float)(*local_148.data)->dValue
                              );
    pVVar6->isFloat = true;
    uVar11 = (value->users).count;
    if (uVar11 != 0) {
      uVar12 = 0;
      do {
        pVVar4 = (value->users).data[uVar12];
        if (((pVVar4 != (VmValue *)0x0) && (pVVar4->typeID == 2)) &&
           (*(int *)&pVVar4[1]._vptr_VmValue == 0x1f)) {
          anon_unknown.dwarf_107107::ReplaceValue(module,pVVar4,value,&pVVar6->super_VmValue);
          module->constantPropagations = module->constantPropagations + 1;
          uVar11 = (value->users).count;
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 < uVar11);
    }
    (module->tempUsers).count = 0;
    goto switchD_0019664c_caseD_8;
  case 0x12:
    if (uVar11 == 0) goto LAB_0019759a;
    value_00 = (double)(*local_148.data)->iValue;
    goto LAB_00197450;
  case 0x13:
    if (uVar11 == 0) goto LAB_0019759a;
    value_00 = (double)(*local_148.data)->lValue;
    goto LAB_00197450;
  case 0x14:
    if (uVar11 == 0) goto LAB_0019759a;
    uVar12 = (ulong)(*local_148.data)->iValue;
    break;
  case 0x15:
    if (uVar11 == 0) goto LAB_0019759a;
    uVar11 = (uint)(*local_148.data)->lValue;
    goto LAB_001972fc;
  case 0x16:
    if ((((uVar11 == 0) || (uVar11 == 1)) || (uVar11 < 3)) || (uVar11 == 3)) goto LAB_0019759a;
    if ((uint)local_148.data[3]->iValue < (uint)(*local_148.data)->iValue) {
      pVVar6 = CreateConstantPointer
                         (module->allocator,value->source,
                          local_148.data[3]->iValue * local_148.data[1]->iValue +
                          local_148.data[2]->iValue,local_148.data[2]->container,
                          (value->type).structType,true);
      anon_unknown.dwarf_107107::ReplaceValueUsersWith
                (module,value,&pVVar6->super_VmValue,&module->constantPropagations);
    }
    goto switchD_0019664c_caseD_8;
  case 0x22:
    VVar1 = (value->type).type;
    if (VVar1 != VM_TYPE_POINTER) {
      uVar7 = (value->type).size;
      if (uVar7 == 4 && VVar1 == VM_TYPE_INT) {
        if ((uVar11 == 1) || (uVar11 == 0)) goto LAB_0019759a;
        uVar11 = local_148.data[1]->iValue + (*local_148.data)->iValue;
        goto LAB_001972fc;
      }
      uVar7 = uVar7 ^ 8;
      if (VVar1 == VM_TYPE_DOUBLE && uVar7 == 0) {
        if ((uVar11 == 1) || (uVar11 == 0)) goto LAB_0019759a;
        value_00 = (*local_148.data)->dValue + local_148.data[1]->dValue;
        goto LAB_00197450;
      }
      if (VVar1 != VM_TYPE_LONG || uVar7 != 0) goto switchD_0019664c_caseD_8;
      if ((uVar11 == 1) || (uVar11 == 0)) goto LAB_0019759a;
      uVar12 = local_148.data[1]->lValue + (*local_148.data)->lValue;
      break;
    }
    if (uVar11 == 0) goto LAB_0019759a;
    pVVar6 = *local_148.data;
    container = pVVar6->container;
    if (container == (VariableData *)0x0) {
      if (uVar11 == 1) goto LAB_0019759a;
      iVar9 = local_148.data[1]->iValue + pVVar6->iValue;
      container = local_148.data[1]->container;
    }
    else {
      if (uVar11 == 1) goto LAB_0019759a;
      if (local_148.data[1]->container != (VariableData *)0x0) {
        __assert_fail("!(consts[0]->container && consts[1]->container)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0x123e,
                      "void RunConstantPropagation(ExpressionContext &, VmModule *, VmValue *, bool)"
                     );
      }
      iVar9 = local_148.data[1]->iValue + pVVar6->iValue;
    }
    pVVar6 = CreateConstantPointer
                       (module->allocator,value->source,iVar9,container,(value->type).structType,
                        true);
    goto LAB_0019730c;
  case 0x23:
    VVar1 = (value->type).type;
    uVar7 = (value->type).size;
    if (uVar7 == 4 && VVar1 == VM_TYPE_INT) {
      if ((uVar11 == 1) || (uVar11 == 0)) goto LAB_0019759a;
      pVVar6 = local_148.data[1];
      iVar9 = (*local_148.data)->iValue;
LAB_00196c74:
      uVar11 = iVar9 - pVVar6->iValue;
      goto LAB_001972fc;
    }
    uVar7 = uVar7 ^ 8;
    if (VVar1 == VM_TYPE_DOUBLE && uVar7 == 0) {
      if ((uVar11 == 1) || (uVar11 == 0)) goto LAB_0019759a;
      value_00 = (*local_148.data)->dValue - local_148.data[1]->dValue;
      goto LAB_00197450;
    }
    if (VVar1 != VM_TYPE_LONG || uVar7 != 0) goto switchD_0019664c_caseD_8;
    if ((uVar11 == 1) || (uVar11 == 0)) goto LAB_0019759a;
    pVVar6 = local_148.data[1];
    lVar10 = (*local_148.data)->lValue;
LAB_001972c9:
    uVar12 = lVar10 - pVVar6->lValue;
    break;
  case 0x24:
    VVar1 = (value->type).type;
    uVar7 = (value->type).size;
    if (uVar7 == 4 && VVar1 == VM_TYPE_INT) {
      if ((uVar11 == 1) || (uVar11 == 0)) goto LAB_0019759a;
      uVar11 = local_148.data[1]->iValue * (*local_148.data)->iValue;
      goto LAB_001972fc;
    }
    uVar7 = uVar7 ^ 8;
    if (VVar1 == VM_TYPE_DOUBLE && uVar7 == 0) {
      if ((uVar11 == 1) || (uVar11 == 0)) goto LAB_0019759a;
      value_00 = (*local_148.data)->dValue * local_148.data[1]->dValue;
      goto LAB_00197450;
    }
    if (VVar1 != VM_TYPE_LONG || uVar7 != 0) goto switchD_0019664c_caseD_8;
    if ((uVar11 == 1) || (uVar11 == 0)) goto LAB_0019759a;
    uVar12 = local_148.data[1]->lValue * (*local_148.data)->lValue;
    break;
  case 0x25:
    if (uVar11 < 2) goto LAB_0019759a;
    bVar13 = IsConstantZero(&local_148.data[1]->super_VmValue);
    if (bVar13) goto switchD_0019664c_caseD_8;
    VVar1 = (value->type).type;
    uVar11 = (value->type).size;
    if (uVar11 == 4 && VVar1 == VM_TYPE_INT) {
      if ((local_148.count == 1) || (local_148.count == 0)) goto LAB_0019759a;
      uVar11 = (*local_148.data)->iValue / local_148.data[1]->iValue;
      goto LAB_001972fc;
    }
    uVar11 = uVar11 ^ 8;
    if (VVar1 == VM_TYPE_DOUBLE && uVar11 == 0) {
      if ((local_148.count == 1) || (local_148.count == 0)) goto LAB_0019759a;
      value_00 = (*local_148.data)->dValue / local_148.data[1]->dValue;
      goto LAB_00197450;
    }
    if (VVar1 != VM_TYPE_LONG || uVar11 != 0) goto switchD_0019664c_caseD_8;
    if ((local_148.count == 1) || (local_148.count == 0)) goto LAB_0019759a;
    uVar12 = (*local_148.data)->lValue / local_148.data[1]->lValue;
    break;
  case 0x27:
    if (uVar11 < 2) goto LAB_0019759a;
    bVar13 = IsConstantZero(&local_148.data[1]->super_VmValue);
    if (bVar13) goto switchD_0019664c_caseD_8;
    VVar1 = (value->type).type;
    uVar11 = (value->type).size;
    if (uVar11 == 4 && VVar1 == VM_TYPE_INT) {
      if ((local_148.count == 1) || (local_148.count == 0)) goto LAB_0019759a;
      uVar11 = (*local_148.data)->iValue % local_148.data[1]->iValue;
      goto LAB_001972fc;
    }
    if (uVar11 != 8 || VVar1 != VM_TYPE_LONG) goto switchD_0019664c_caseD_8;
    if ((local_148.count == 1) || (local_148.count == 0)) goto LAB_0019759a;
    uVar12 = (*local_148.data)->lValue % local_148.data[1]->lValue;
    break;
  case 0x28:
    if (uVar11 == 0) goto LAB_0019759a;
    pVVar6 = *local_148.data;
    VVar1 = (pVVar6->super_VmValue).type.type;
    uVar7 = (pVVar6->super_VmValue).type.size;
    if (uVar7 == 4 && VVar1 == VM_TYPE_INT) {
      if (uVar11 == 1) goto LAB_0019759a;
      bVar14 = SBORROW4(pVVar6->iValue,local_148.data[1]->iValue);
      bVar13 = pVVar6->iValue - local_148.data[1]->iValue < 0;
    }
    else {
      uVar7 = uVar7 ^ 8;
      if (VVar1 == VM_TYPE_DOUBLE && uVar7 == 0) {
        if (uVar11 == 1) goto LAB_0019759a;
        bVar13 = local_148.data[1]->dValue == pVVar6->dValue;
        bVar14 = local_148.data[1]->dValue < pVVar6->dValue;
LAB_00197149:
        uVar11 = (uint)(!bVar14 && !bVar13);
        goto LAB_001972fc;
      }
      if (VVar1 != VM_TYPE_LONG || uVar7 != 0) goto switchD_0019664c_caseD_8;
      if (uVar11 == 1) goto LAB_0019759a;
      bVar14 = SBORROW8(pVVar6->lValue,local_148.data[1]->lValue);
      bVar13 = pVVar6->lValue - local_148.data[1]->lValue < 0;
    }
    uVar11 = (uint)(bVar14 != bVar13);
    goto LAB_001972fc;
  case 0x29:
    if (uVar11 == 0) goto LAB_0019759a;
    pVVar6 = *local_148.data;
    VVar1 = (pVVar6->super_VmValue).type.type;
    uVar7 = (pVVar6->super_VmValue).type.size;
    if (uVar7 == 4 && VVar1 == VM_TYPE_INT) {
      if (uVar11 == 1) goto LAB_0019759a;
      iVar2 = pVVar6->iValue;
      iVar9 = local_148.data[1]->iValue;
      bVar15 = SBORROW4(iVar2,iVar9);
      bVar14 = iVar2 - iVar9 < 0;
      bVar13 = iVar2 == iVar9;
    }
    else {
      uVar7 = uVar7 ^ 8;
      if (VVar1 == VM_TYPE_DOUBLE && uVar7 == 0) {
        if (uVar11 == 1) goto LAB_0019759a;
        bVar13 = pVVar6->dValue == local_148.data[1]->dValue;
        bVar14 = pVVar6->dValue < local_148.data[1]->dValue;
        goto LAB_00197149;
      }
      if (VVar1 != VM_TYPE_LONG || uVar7 != 0) goto switchD_0019664c_caseD_8;
      if (uVar11 == 1) goto LAB_0019759a;
      lVar10 = pVVar6->lValue;
      lVar5 = local_148.data[1]->lValue;
      bVar15 = SBORROW8(lVar10,lVar5);
      bVar14 = lVar10 - lVar5 < 0;
      bVar13 = lVar10 == lVar5;
    }
    uVar11 = (uint)(!bVar13 && bVar15 == bVar14);
    goto LAB_001972fc;
  case 0x2a:
    if (uVar11 == 0) goto LAB_0019759a;
    pVVar6 = *local_148.data;
    VVar1 = (pVVar6->super_VmValue).type.type;
    uVar7 = (pVVar6->super_VmValue).type.size;
    if (uVar7 == 4 && VVar1 == VM_TYPE_INT) {
      if (uVar11 == 1) goto LAB_0019759a;
      iVar2 = pVVar6->iValue;
      iVar9 = local_148.data[1]->iValue;
      bVar15 = SBORROW4(iVar2,iVar9);
      bVar14 = iVar2 - iVar9 < 0;
      bVar13 = iVar2 == iVar9;
    }
    else {
      uVar7 = uVar7 ^ 8;
      if (VVar1 == VM_TYPE_DOUBLE && uVar7 == 0) {
        if (uVar11 == 1) goto LAB_0019759a;
        bVar13 = local_148.data[1]->dValue < pVVar6->dValue;
LAB_001971b7:
        uVar11 = (uint)!bVar13;
        goto LAB_001972fc;
      }
      if (VVar1 != VM_TYPE_LONG || uVar7 != 0) goto switchD_0019664c_caseD_8;
      if (uVar11 == 1) goto LAB_0019759a;
      lVar10 = pVVar6->lValue;
      lVar5 = local_148.data[1]->lValue;
      bVar15 = SBORROW8(lVar10,lVar5);
      bVar14 = lVar10 - lVar5 < 0;
      bVar13 = lVar10 == lVar5;
    }
    uVar11 = (uint)(bVar13 || bVar15 != bVar14);
    goto LAB_001972fc;
  case 0x2b:
    if (uVar11 == 0) goto LAB_0019759a;
    pVVar6 = *local_148.data;
    VVar1 = (pVVar6->super_VmValue).type.type;
    uVar7 = (pVVar6->super_VmValue).type.size;
    if (uVar7 == 4 && VVar1 == VM_TYPE_INT) {
      if (uVar11 == 1) goto LAB_0019759a;
      bVar14 = SBORROW4(pVVar6->iValue,local_148.data[1]->iValue);
      bVar13 = pVVar6->iValue - local_148.data[1]->iValue < 0;
    }
    else {
      uVar7 = uVar7 ^ 8;
      if (VVar1 == VM_TYPE_DOUBLE && uVar7 == 0) {
        if (uVar11 == 1) goto LAB_0019759a;
        bVar13 = pVVar6->dValue < local_148.data[1]->dValue;
        goto LAB_001971b7;
      }
      if (VVar1 != VM_TYPE_LONG || uVar7 != 0) goto switchD_0019664c_caseD_8;
      if (uVar11 == 1) goto LAB_0019759a;
      bVar14 = SBORROW8(pVVar6->lValue,local_148.data[1]->lValue);
      bVar13 = pVVar6->lValue - local_148.data[1]->lValue < 0;
    }
    uVar11 = (uint)(bVar14 == bVar13);
    goto LAB_001972fc;
  case 0x2c:
    if (uVar11 == 0) goto LAB_0019759a;
    pVVar6 = *local_148.data;
    VVar1 = (pVVar6->super_VmValue).type.type;
    uVar7 = (pVVar6->super_VmValue).type.size;
    if (uVar7 == 4 && VVar1 == VM_TYPE_INT) {
      if (uVar11 == 1) goto LAB_0019759a;
      bVar13 = pVVar6->iValue == local_148.data[1]->iValue;
    }
    else {
      uVar7 = uVar7 ^ 8;
      if (VVar1 == VM_TYPE_DOUBLE && uVar7 == 0) {
        if (uVar11 == 1) goto LAB_0019759a;
        bVar13 = local_148.data[1]->dValue == pVVar6->dValue;
LAB_001970d6:
        uVar11 = -(uint)bVar13 & 1;
        goto LAB_001972fc;
      }
      if (VVar1 != VM_TYPE_LONG || uVar7 != 0) goto switchD_0019664c_caseD_8;
      if (uVar11 == 1) goto LAB_0019759a;
      bVar13 = pVVar6->lValue == local_148.data[1]->lValue;
    }
    goto LAB_001972f9;
  case 0x2d:
    if (uVar11 == 0) goto LAB_0019759a;
    pVVar6 = *local_148.data;
    VVar1 = (pVVar6->super_VmValue).type.type;
    uVar7 = (pVVar6->super_VmValue).type.size;
    if (uVar7 == 4 && VVar1 == VM_TYPE_INT) {
      if (uVar11 == 1) goto LAB_0019759a;
      bVar13 = pVVar6->iValue == local_148.data[1]->iValue;
    }
    else {
      uVar7 = uVar7 ^ 8;
      if (VVar1 == VM_TYPE_DOUBLE && uVar7 == 0) {
        if (uVar11 == 1) goto LAB_0019759a;
        bVar13 = local_148.data[1]->dValue != pVVar6->dValue;
        goto LAB_001970d6;
      }
      if (VVar1 != VM_TYPE_LONG || uVar7 != 0) goto switchD_0019664c_caseD_8;
      if (uVar11 == 1) goto LAB_0019759a;
      bVar13 = pVVar6->lValue == local_148.data[1]->lValue;
    }
    uVar11 = (uint)!bVar13;
    goto LAB_001972fc;
  case 0x2e:
    VVar1 = (value->type).type;
    uVar7 = (value->type).size;
    if (uVar7 == 4 && VVar1 == VM_TYPE_INT) {
      if ((uVar11 == 1) || (uVar11 == 0)) goto LAB_0019759a;
      uVar11 = (*local_148.data)->iValue << ((byte)local_148.data[1]->iValue & 0x1f);
      goto LAB_001972fc;
    }
    if (uVar7 != 8 || VVar1 != VM_TYPE_LONG) goto switchD_0019664c_caseD_8;
    if ((uVar11 == 1) || (uVar11 == 0)) goto LAB_0019759a;
    uVar12 = (*local_148.data)->lValue << ((byte)local_148.data[1]->lValue & 0x3f);
    break;
  case 0x2f:
    VVar1 = (value->type).type;
    uVar7 = (value->type).size;
    if (uVar7 == 4 && VVar1 == VM_TYPE_INT) {
      if ((uVar11 == 1) || (uVar11 == 0)) goto LAB_0019759a;
      uVar11 = (*local_148.data)->iValue >> ((byte)local_148.data[1]->iValue & 0x1f);
      goto LAB_001972fc;
    }
    if (uVar7 != 8 || VVar1 != VM_TYPE_LONG) goto switchD_0019664c_caseD_8;
    if ((uVar11 == 1) || (uVar11 == 0)) goto LAB_0019759a;
    uVar12 = (*local_148.data)->lValue >> ((byte)local_148.data[1]->lValue & 0x3f);
    break;
  case 0x30:
    VVar1 = (value->type).type;
    uVar7 = (value->type).size;
    if (uVar7 == 4 && VVar1 == VM_TYPE_INT) {
      if ((uVar11 == 1) || (uVar11 == 0)) goto LAB_0019759a;
      uVar11 = local_148.data[1]->iValue & (*local_148.data)->iValue;
      goto LAB_001972fc;
    }
    if (uVar7 != 8 || VVar1 != VM_TYPE_LONG) goto switchD_0019664c_caseD_8;
    if ((uVar11 == 1) || (uVar11 == 0)) goto LAB_0019759a;
    uVar12 = local_148.data[1]->lValue & (*local_148.data)->lValue;
    break;
  case 0x31:
    VVar1 = (value->type).type;
    uVar7 = (value->type).size;
    if (uVar7 == 4 && VVar1 == VM_TYPE_INT) {
      if ((uVar11 == 1) || (uVar11 == 0)) goto LAB_0019759a;
      uVar11 = local_148.data[1]->iValue | (*local_148.data)->iValue;
      goto LAB_001972fc;
    }
    if (uVar7 != 8 || VVar1 != VM_TYPE_LONG) goto switchD_0019664c_caseD_8;
    if ((uVar11 == 1) || (uVar11 == 0)) goto LAB_0019759a;
    uVar12 = local_148.data[1]->lValue | (*local_148.data)->lValue;
    break;
  case 0x32:
    VVar1 = (value->type).type;
    uVar7 = (value->type).size;
    if (uVar7 == 4 && VVar1 == VM_TYPE_INT) {
      if ((uVar11 == 1) || (uVar11 == 0)) goto LAB_0019759a;
      uVar11 = local_148.data[1]->iValue ^ (*local_148.data)->iValue;
      goto LAB_001972fc;
    }
    if (uVar7 != 8 || VVar1 != VM_TYPE_LONG) goto switchD_0019664c_caseD_8;
    if ((uVar11 == 1) || (uVar11 == 0)) goto LAB_0019759a;
    uVar12 = local_148.data[1]->lValue ^ (*local_148.data)->lValue;
    break;
  case 0x44:
    VVar1 = (value->type).type;
    uVar7 = (value->type).size;
    if (uVar7 == 4 && VVar1 == VM_TYPE_INT) {
      if (uVar11 == 0) goto LAB_0019759a;
      pVVar6 = *local_148.data;
      iVar9 = 0;
      goto LAB_00196c74;
    }
    uVar7 = uVar7 ^ 8;
    if (VVar1 != VM_TYPE_DOUBLE || uVar7 != 0) {
      if (VVar1 != VM_TYPE_LONG || uVar7 != 0) goto switchD_0019664c_caseD_8;
      if (uVar11 == 0) goto LAB_0019759a;
      pVVar6 = *local_148.data;
      lVar10 = 0;
      goto LAB_001972c9;
    }
    if (uVar11 == 0) goto LAB_0019759a;
    value_00 = -(*local_148.data)->dValue;
LAB_00197450:
    pVVar6 = CreateConstantDouble(module->allocator,value->source,value_00);
    goto LAB_0019730c;
  case 0x45:
    VVar1 = (value->type).type;
    uVar7 = (value->type).size;
    if (uVar7 == 4 && VVar1 == VM_TYPE_INT) {
      if (uVar11 == 0) goto LAB_0019759a;
      uVar11 = ~(*local_148.data)->iValue;
      goto LAB_001972fc;
    }
    if (uVar7 != 8 || VVar1 != VM_TYPE_LONG) goto switchD_0019664c_caseD_8;
    if (uVar11 == 0) goto LAB_0019759a;
    uVar12 = ~(*local_148.data)->lValue;
    break;
  case 0x46:
    if (uVar11 == 0) goto LAB_0019759a;
    pVVar6 = *local_148.data;
    VVar1 = (pVVar6->super_VmValue).type.type;
    uVar11 = (pVVar6->super_VmValue).type.size;
    if (uVar11 == 4 && VVar1 == VM_TYPE_INT) {
      bVar13 = pVVar6->iValue == 0;
    }
    else {
      if (uVar11 != 8 || VVar1 != VM_TYPE_LONG) goto switchD_0019664c_caseD_8;
      bVar13 = pVVar6->lValue == 0;
    }
LAB_001972f9:
    uVar11 = (uint)bVar13;
LAB_001972fc:
    pVVar6 = CreateConstantInt(module->allocator,value->source,uVar11);
    goto LAB_0019730c;
  }
  pVVar6 = CreateConstantLong(module->allocator,value->source,uVar12);
LAB_0019730c:
  anon_unknown.dwarf_107107::ReplaceValueUsersWith
            (module,value,&pVVar6->super_VmValue,&module->constantPropagations);
switchD_0019664c_caseD_8:
  SmallArray<VmConstant_*,_32U>::~SmallArray(&local_148);
  return;
}

Assistant:

VmValue* CreateOr(VmModule *module, SynBase *source, VmValue *lhs, VmValue *rhs)
	{
		assert(lhs->type == VmType::Int || lhs->type == VmType::Long);
		assert(lhs->type == rhs->type);

		return CreateInstruction(module, source, lhs->type, VM_INST_BIT_OR, lhs, rhs);
	}